

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

void ws_ping(intptr_t fd,fio_protocol_s *ws)

{
  fio_write_args_s options;
  fio_write_args_s options_00;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined1 local_20;
  undefined7 uStack_1f;
  fio_protocol_s *ws_local;
  intptr_t fd_local;
  
  if (*(char *)((long)&ws[3].ping + 1) == '\0') {
    options_00.after.dealloc = FIO_DEALLOC_NOOP;
    options_00.data.buffer = anon_var_dwarf_3ab91;
    options_00.length = 2;
    options_00.offset = 0;
    options_00._32_8_ = CONCAT71(uStack_47,local_48) & 0xfffffffffffffff0;
    fio_write2_fn(fd,options_00);
  }
  else {
    options.after.dealloc = FIO_DEALLOC_NOOP;
    options.data.buffer = anon_var_dwarf_3abaf;
    options.length = 6;
    options.offset = 0;
    options._32_8_ = CONCAT71(uStack_1f,local_20) & 0xfffffffffffffff0;
    fio_write2_fn(fd,options);
  }
  return;
}

Assistant:

static void ws_ping(intptr_t fd, fio_protocol_s *ws) {
  (void)(ws);
  if (((ws_s *)ws)->is_client) {
    fio_write2(fd, .data.buffer = "\x89\x80MASK", .length = 6,
               .after.dealloc = FIO_DEALLOC_NOOP);
  } else {
    fio_write2(fd, .data.buffer = "\x89\x00", .length = 2,
               .after.dealloc = FIO_DEALLOC_NOOP);
  }
}